

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O2

Option * __thiscall CLI::Option::type_size(Option *this,int option_type_size)

{
  if (option_type_size < 0) {
    this->type_size_max_ = -option_type_size;
    this->type_size_min_ = -option_type_size;
    this->expected_max_ = 0x20000000;
    return this;
  }
  this->type_size_max_ = option_type_size;
  if (((uint)option_type_size < 0x20000000) &&
     (this->type_size_min_ = option_type_size, option_type_size == 0)) {
    (this->super_OptionBase<CLI::Option>).required_ = false;
    return this;
  }
  return this;
}

Assistant:

Option *type_size(int option_type_size) {
        if(option_type_size < 0) {
            // this section is included for backwards compatibility
            type_size_max_ = -option_type_size;
            type_size_min_ = -option_type_size;
            expected_max_ = detail::expected_max_vector_size;
        } else {
            type_size_max_ = option_type_size;
            if(type_size_max_ < detail::expected_max_vector_size) {
                type_size_min_ = option_type_size;
            }
            if(type_size_max_ == 0)
                required_ = false;
        }
        return this;
    }